

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.cpp
# Opt level: O0

void handle_signal(int signal_id,SIGFUNC sigfunc,sigaction *previousAction,int additionalFlags)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  _union_1457 local_c0;
  sigaction newAction;
  int additionalFlags_local;
  sigaction *previousAction_local;
  SIGFUNC sigfunc_local;
  int signal_id_local;
  
  newAction.sa_mask.__val[0xf]._0_4_ = additionalFlags | 0x10000004;
  local_c0 = (_union_1457)sigfunc;
  newAction.sa_restorer._4_4_ = additionalFlags;
  sigemptyset((sigset_t *)&newAction);
  iVar2 = sigaction(signal_id,(sigaction *)&local_c0,(sigaction *)previousAction);
  if (iVar2 == -1) {
    fprintf(_stderr,"] %s %s:%d","handle_signal",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/exception/signal.cpp"
            ,0x243);
    __stream = _stderr;
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(__stream,"handle_signal: sigaction() call failed with error code %d (%s)\n",(ulong)uVar1
            ,pcVar5);
  }
  return;
}

Assistant:

void handle_signal(int signal_id, SIGFUNC sigfunc, struct sigaction *previousAction, int additionalFlags)
{
    struct sigaction newAction;

    newAction.sa_flags = SA_RESTART | additionalFlags;
#if HAVE_SIGINFO_T
    newAction.sa_handler = NULL;
    newAction.sa_sigaction = sigfunc;
    newAction.sa_flags |= SA_SIGINFO;
#else   /* HAVE_SIGINFO_T */
    newAction.sa_handler = SIG_DFL;
#endif  /* HAVE_SIGINFO_T */
    sigemptyset(&newAction.sa_mask);

    if (-1 == sigaction(signal_id, &newAction, previousAction))
    {
        ASSERT("handle_signal: sigaction() call failed with error code %d (%s)\n",
            errno, strerror(errno));
    }
}